

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O0

void new_cb(Fl_Widget *param_1,void *v)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  FILE *__stream;
  int *piVar4;
  FILE *__stream_00;
  Fl_Double_Window *__stat_loc;
  FILE *outfile;
  FILE *infile;
  char *next;
  char *ptr;
  char line [1024];
  char *iname;
  char *tname;
  int item;
  void *v_local;
  Fl_Widget *param_0_local;
  
  if (((v != (void *)0x0) || (modflag == 0)) ||
     ((iVar1 = fl_choice("Do you want to save changes to this user\ninterface before creating a new one?"
                         ,"Cancel","Save","Don\'t Save"), iVar1 != 0 &&
      ((iVar1 != 1 || (save_cb((Fl_Widget *)0x0,(void *)0x0), modflag == 0)))))) {
    if (template_panel == (Fl_Double_Window *)0x0) {
      make_template_panel();
    }
    template_clear();
    Fl_Browser::add(template_browser,"Blank",(void *)0x0);
    template_load();
    (*(template_name->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget[6])();
    Fl_Input_::value(&template_name->super_Fl_Input_,"");
    (*(template_instance->super_Fl_Input_).super_Fl_Widget._vptr_Fl_Widget[5])();
    Fl_Widget::deactivate((Fl_Widget *)template_instance);
    Fl_Input_::value(&template_instance->super_Fl_Input_,"");
    (*(template_delete->super_Fl_Widget)._vptr_Fl_Widget[6])();
    Fl_Widget::label((Fl_Widget *)template_submit,"New");
    Fl_Widget::deactivate((Fl_Widget *)template_submit);
    Fl_Window::label(&template_panel->super_Fl_Window,"New");
    iVar1 = Fl_Browser::size(template_browser);
    if (iVar1 == 1) {
      Fl_Browser::value(template_browser,1);
      Fl_Widget::do_callback((Fl_Widget *)template_browser);
    }
    (*(template_panel->super_Fl_Window).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[5])();
    while (__stat_loc = template_panel, iVar1 = Fl_Window::shown(&template_panel->super_Fl_Window),
          iVar1 != 0) {
      Fl::wait(__stat_loc);
    }
    iVar1 = Fl_Browser::value(template_browser);
    if (0 < iVar1) {
      delete_all(0);
      set_filename((char *)0x0);
      pcVar2 = (char *)Fl_Browser::data(template_browser,iVar1);
      if (pcVar2 != (char *)0x0) {
        pcVar3 = Fl_Input_::value(&template_instance->super_Fl_Input_);
        if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
          undo_suspend();
          read_file(pcVar2,0);
          undo_resume();
        }
        else {
          __stream = (FILE *)fl_fopen(pcVar2,"r");
          if (__stream == (FILE *)0x0) {
            piVar4 = __errno_location();
            pcVar3 = strerror(*piVar4);
            fl_alert("Error reading template file \"%s\":\n%s",pcVar2,pcVar3);
            set_modflag(0);
            undo_clear();
            return;
          }
          pcVar2 = cutfname(1);
          __stream_00 = (FILE *)fl_fopen(pcVar2,"w");
          if (__stream_00 == (FILE *)0x0) {
            pcVar2 = cutfname(1);
            piVar4 = __errno_location();
            pcVar3 = strerror(*piVar4);
            fl_alert("Error writing buffer file \"%s\":\n%s",pcVar2,pcVar3);
            fclose(__stream);
            set_modflag(0);
            undo_clear();
            return;
          }
          while (pcVar2 = fgets((char *)&ptr,0x400,__stream), pcVar2 != (char *)0x0) {
            next = (char *)&ptr;
            while (pcVar2 = strstr(next,"@INSTANCE@"), pcVar2 != (char *)0x0) {
              fwrite(next,(long)pcVar2 - (long)next,1,__stream_00);
              fputs(pcVar3,__stream_00);
              next = pcVar2 + 10;
            }
            fputs(next,__stream_00);
          }
          fclose(__stream);
          fclose(__stream_00);
          undo_suspend();
          pcVar2 = cutfname(1);
          read_file(pcVar2,0);
          pcVar2 = cutfname(1);
          unlink(pcVar2);
          undo_resume();
        }
      }
      set_modflag(0);
      undo_clear();
    }
  }
  return;
}

Assistant:

void new_cb(Fl_Widget *, void *v) {
  // Check if the current file has been modified...
  if (!v && modflag) {
    // Yes, ask the user what to do...
    switch (fl_choice("Do you want to save changes to this user\n"
                      "interface before creating a new one?", "Cancel",
                      "Save", "Don't Save"))
    {
      case 0 : /* Cancel */
          return;
      case 1 : /* Save */
          save_cb(NULL, NULL);
	  if (modflag) return;	// Didn't save!
    }
  }

  // Setup the template panel...
  if (!template_panel) make_template_panel();

  template_clear();
  template_browser->add("Blank");
  template_load();

  template_name->hide();
  template_name->value("");

  template_instance->show();
  template_instance->deactivate();
  template_instance->value("");

  template_delete->hide();

  template_submit->label("New");
  template_submit->deactivate();

  template_panel->label("New");

  if ( template_browser->size() == 1 ) { // only one item?
    template_browser->value(1);          // select it
    template_browser->do_callback();
  }

  // Show the panel and wait for the user to do something...
  template_panel->show();
  while (template_panel->shown()) Fl::wait();

  // See if the user chose anything...
  int item = template_browser->value();
  if (item < 1) return;

  // Clear the current data...
  delete_all();
  set_filename(NULL);

  // Load the template, if any...
  const char *tname = (const char *)template_browser->data(item);

  if (tname) {
    // Grab the instance name...
    const char *iname = template_instance->value();

    if (iname && *iname) {
      // Copy the template to a temp file, then read it in...
      char line[1024], *ptr, *next;
      FILE *infile, *outfile;

      if ((infile = fl_fopen(tname, "r")) == NULL) {
	fl_alert("Error reading template file \"%s\":\n%s", tname,
        	 strerror(errno));
	set_modflag(0);
	undo_clear();
	return;
      }

      if ((outfile = fl_fopen(cutfname(1), "w")) == NULL) {
	fl_alert("Error writing buffer file \"%s\":\n%s", cutfname(1),
        	 strerror(errno));
	fclose(infile);
	set_modflag(0);
	undo_clear();
	return;
      }

      while (fgets(line, sizeof(line), infile)) {
	// Replace @INSTANCE@ with the instance name...
	for (ptr = line; (next = strstr(ptr, "@INSTANCE@")) != NULL; ptr = next + 10) {
	  fwrite(ptr, next - ptr, 1, outfile);
	  fputs(iname, outfile);
	}

	fputs(ptr, outfile);
      }

      fclose(infile);
      fclose(outfile);

      undo_suspend();
      read_file(cutfname(1), 0);
      unlink(cutfname(1));
      undo_resume();
    } else {
      // No instance name, so read the template without replacements...
      undo_suspend();
      read_file(tname, 0);
      undo_resume();
    }
  }

  set_modflag(0);
  undo_clear();
}